

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextVkImpl::FinishFrame(DeviceContextVkImpl *this)

{
  undefined *puVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Uint32 UVar5;
  unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
  *this_00;
  reference ppVar6;
  undefined4 extraout_var;
  size_t sVar7;
  undefined8 uVar8;
  RenderPassVkImpl *pRVar9;
  char (*CmdQueueMask) [64];
  Char *Message;
  RenderDeviceVkImpl *DeviceVkImpl;
  char *in_RCX;
  char (*Args_1) [64];
  char (*in_R8) [154];
  undefined1 local_140 [8];
  string msg;
  Uint64 QueueMask;
  string _msg_5;
  string _msg_4;
  string _msg_3;
  string _msg_2;
  undefined1 local_88 [8];
  string _msg_1;
  undefined1 local_58 [8];
  string _msg;
  BufferDesc *BuffDesc;
  pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>
  *MappedBuffIt;
  iterator __end1;
  iterator __begin1;
  unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
  *__range1;
  DeviceContextVkImpl *this_local;
  
  this_00 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DbgMappedBuffers;
  __end1 = std::
           unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
           ::begin(this_00);
  MappedBuffIt = (pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>
                  *)std::
                    unordered_map<Diligent::IBuffer_*,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo,_std::hash<Diligent::IBuffer_*>,_std::equal_to<Diligent::IBuffer_*>,_std::allocator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>_>_>
                    ::end(this_00);
  while (bVar2 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
                            ,(_Node_iterator_base<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false>
                              *)&MappedBuffIt), bVar2) {
    ppVar6 = std::__detail::
             _Node_iterator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false,_false>
             ::operator*(&__end1);
    iVar4 = (*(ppVar6->first->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    _msg.field_2._8_8_ = CONCAT44(extraout_var,iVar4);
    if ((*(char (*) [17])(_msg.field_2._8_8_ + 0x11))[3] == '\x02') {
      in_RCX = 
      "\' is still mapped when finishing the frame. The contents of the buffer and mapped address will become invalid"
      ;
      FormatString<char[17],char_const*,char[110]>
                ((string *)local_58,(Diligent *)"Dynamic buffer \'",
                 (char (*) [17])_msg.field_2._8_8_,
                 (char **)
                 "\' is still mapped when finishing the frame. The contents of the buffer and mapped address will become invalid"
                 ,(char (*) [110])in_R8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        in_RCX = (char *)0x0;
        in_R8 = (char (*) [154])in_RCX;
        (*(code *)puVar1)(1,uVar8,0);
      }
      std::__cxx11::string::~string((string *)local_58);
    }
    std::__detail::
    _Node_iterator<std::pair<Diligent::IBuffer_*const,_Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DbgMappedBufferInfo>,_false,_false>
    ::operator++(&__end1);
  }
  sVar7 = GetNumCommandsInCtx(this);
  if (sVar7 != 0) {
    bVar2 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                      ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
    if (bVar2) {
      _msg_2.field_2._M_local_buf[0xf] =
           (char)DeviceContextBase<Diligent::EngineVkImplTraits>::GetContextId
                           ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
      in_RCX = 
      " when finishing the frame. This is an error and may cause unpredicted behaviour. Close all deferred contexts and execute them before finishing the frame."
      ;
      FormatString<char[60],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[154]>
                ((string *)local_88,
                 (Diligent *)"There are outstanding commands in deferred device context #",
                 (char (*) [60])((long)&_msg_2.field_2 + 0xf),
                 (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)
                 " when finishing the frame. This is an error and may cause unpredicted behaviour. Close all deferred contexts and execute them before finishing the frame."
                 ,in_R8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        in_RCX = (char *)0x0;
        in_R8 = (char (*) [154])in_RCX;
        (*(code *)puVar1)(2,uVar8,0);
      }
      std::__cxx11::string::~string((string *)local_88);
    }
    else {
      FormatString<char[221]>
                ((string *)((long)&_msg_3.field_2 + 8),
                 (char (*) [221])
                 "There are outstanding commands in the immediate device context when finishing the frame. This is an error and may cause unpredicted behaviour. Call Flush() to submit all commands for execution before finishing the frame."
                );
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar8 = std::__cxx11::string::c_str();
        in_RCX = (char *)0x0;
        in_R8 = (char (*) [154])in_RCX;
        (*(code *)puVar1)(2,uVar8,0);
      }
      std::__cxx11::string::~string((string *)(_msg_3.field_2._M_local_buf + 8));
    }
  }
  if (0 < this->m_ActiveQueriesCounter) {
    in_RCX = 
    " active queries in the device context when finishing the frame. All queries must be ended before the frame is finished."
    ;
    FormatString<char[11],int,char[120]>
              ((string *)((long)&_msg_4.field_2 + 8),(Diligent *)"There are ",
               (char (*) [11])&this->m_ActiveQueriesCounter,
               (int *)
               " active queries in the device context when finishing the frame. All queries must be ended before the frame is finished."
               ,(char (*) [120])in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar8 = std::__cxx11::string::c_str();
      in_RCX = (char *)0x0;
      (*(code *)puVar1)(2,uVar8,0);
    }
    std::__cxx11::string::~string((string *)(_msg_4.field_2._M_local_buf + 8));
  }
  pRVar9 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (pRVar9 != (RenderPassVkImpl *)0x0) {
    FormatString<char[46]>
              ((string *)((long)&_msg_5.field_2 + 8),
               (char (*) [46])"Finishing frame inside an active render pass.");
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar8 = std::__cxx11::string::c_str();
      in_RCX = (char *)0x0;
      (*(code *)puVar1)(2,uVar8,0);
    }
    std::__cxx11::string::~string((string *)(_msg_5.field_2._M_local_buf + 8));
  }
  bVar2 = std::
          unordered_map<Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture,_Diligent::DeviceContextVkImpl::MappedTextureKey::Hasher,_std::equal_to<Diligent::DeviceContextVkImpl::MappedTextureKey>,_std::allocator<std::pair<const_Diligent::DeviceContextVkImpl::MappedTextureKey,_Diligent::DeviceContextVkImpl::MappedTexture>_>_>
          ::empty(&this->m_MappedTextures);
  if (!bVar2) {
    FormatString<char[153]>
              ((string *)&QueueMask,
               (char (*) [153])
               "There are mapped textures in the device context when finishing the frame. All dynamic resources must be used in the same frame in which they are mapped."
              );
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar8 = std::__cxx11::string::c_str();
      in_RCX = (char *)0x0;
      (*(code *)puVar1)(2,uVar8,0);
    }
    std::__cxx11::string::~string((string *)&QueueMask);
  }
  CmdQueueMask = (char (*) [64])
                 DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::
                 GetSubmittedBuffersCmdQueueMask
                           (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  bVar3 = DeviceContextBase<Diligent::EngineVkImplTraits>::IsDeferred
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
  Args_1 = (char (*) [64])CONCAT71((int7)((ulong)in_RCX >> 8),bVar3);
  bVar2 = true;
  if (!bVar3) {
    msg.field_2._M_local_buf[0xf] =
         (char)DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    UVar5 = IndexWrapper::operator_cast_to_unsigned_int
                      ((IndexWrapper *)(msg.field_2._M_local_buf + 0xf));
    Args_1 = (char (*) [64])(1L << ((byte)UVar5 & 0x3f));
    bVar2 = CmdQueueMask == Args_1;
  }
  if (!bVar2) {
    FormatString<char[26],char[64]>
              ((string *)local_140,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"IsDeferred() || QueueMask == (Uint64{1} << GetCommandQueueId())",
               Args_1);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"FinishFrame",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x580);
    std::__cxx11::string::~string((string *)local_140);
  }
  VulkanUploadHeap::ReleaseAllocatedPages(&this->m_UploadHeap,(Uint64)CmdQueueMask);
  DeviceVkImpl = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator*
                           (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                             super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
  VulkanDynamicHeap::ReleaseMasterBlocks(&this->m_DynamicHeap,DeviceVkImpl,(Uint64)CmdQueueMask);
  DynamicDescriptorSetAllocator::ReleasePools
            (&this->m_DynamicDescrSetAllocator,(Uint64)CmdQueueMask);
  DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::EndFrame
            (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  return;
}

Assistant:

void DeviceContextVkImpl::FinishFrame()
{
#ifdef DILIGENT_DEBUG
    for (const auto& MappedBuffIt : m_DbgMappedBuffers)
    {
        const BufferDesc& BuffDesc = MappedBuffIt.first->GetDesc();
        if (BuffDesc.Usage == USAGE_DYNAMIC)
        {
            LOG_WARNING_MESSAGE("Dynamic buffer '", BuffDesc.Name, "' is still mapped when finishing the frame. The contents of the buffer and mapped address will become invalid");
        }
    }
#endif

    if (GetNumCommandsInCtx() != 0)
    {
        if (IsDeferred())
        {
            LOG_ERROR_MESSAGE("There are outstanding commands in deferred device context #", GetContextId(),
                              " when finishing the frame. This is an error and may cause unpredicted behaviour."
                              " Close all deferred contexts and execute them before finishing the frame.");
        }
        else
        {
            LOG_ERROR_MESSAGE("There are outstanding commands in the immediate device context when finishing the frame."
                              " This is an error and may cause unpredicted behaviour. Call Flush() to submit all commands"
                              " for execution before finishing the frame.");
        }
    }

    if (m_ActiveQueriesCounter > 0)
    {
        LOG_ERROR_MESSAGE("There are ", m_ActiveQueriesCounter,
                          " active queries in the device context when finishing the frame. "
                          "All queries must be ended before the frame is finished.");
    }

    if (m_pActiveRenderPass != nullptr)
    {
        LOG_ERROR_MESSAGE("Finishing frame inside an active render pass.");
    }

    if (!m_MappedTextures.empty())
    {
        LOG_ERROR_MESSAGE("There are mapped textures in the device context when finishing the frame. All dynamic resources must be used in the same frame in which they are mapped.");
    }

    const Uint64 QueueMask = GetSubmittedBuffersCmdQueueMask();
    VERIFY_EXPR(IsDeferred() || QueueMask == (Uint64{1} << GetCommandQueueId()));

    // Release resources used by the context during this frame.

    // Upload heap returns all allocated pages to the global memory manager.
    // Note: as global memory manager is hosted by the render device, the upload heap can be destroyed
    // before the pages are actually returned to the manager.
    m_UploadHeap.ReleaseAllocatedPages(QueueMask);

    // Dynamic heap returns all allocated master blocks to the global dynamic memory manager.
    // Note: as global dynamic memory manager is hosted by the render device, the dynamic heap can
    // be destroyed before the blocks are actually returned to the global dynamic memory manager.
    m_DynamicHeap.ReleaseMasterBlocks(*m_pDevice, QueueMask);

    // Dynamic descriptor set allocator returns all allocated pools to the global dynamic descriptor pool manager.
    // Note: as global pool manager is hosted by the render device, the allocator can
    // be destroyed before the pools are actually returned to the global pool manager.
    m_DynamicDescrSetAllocator.ReleasePools(QueueMask);

    EndFrame();
}